

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O2

char __thiscall libchars::command_cursor::current_char(command_cursor *this)

{
  _Elt_pointer ppcVar1;
  command_node *pcVar2;
  char *pcVar3;
  
  ppcVar1 = (this->S).c.
            super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppcVar1 ==
      (this->S).c.
      super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>._M_impl
      .super__Deque_impl_data._M_start._M_cur) {
    pcVar2 = this->root;
    if ((pcVar2 != (command_node *)0x0) && (this->root_idx < (pcVar2->part)._M_string_length))
    goto LAB_0010f1cb;
  }
  else {
    if (ppcVar1 ==
        (this->S).c.
        super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>.
        _M_impl.super__Deque_impl_data._M_finish._M_first) {
      ppcVar1 = (this->S).c.
                super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    pcVar2 = ppcVar1[-1];
    if ((pcVar2 != (command_node *)0x0) && (this->idx < (pcVar2->part)._M_string_length)) {
LAB_0010f1cb:
      pcVar3 = (char *)std::__cxx11::string::at((ulong)pcVar2);
      return *pcVar3;
    }
  }
  return '\0';
}

Assistant:

char command_cursor::current_char() const
    {
        if (S.empty()) {
            if (root != NULL && root_idx < root->part.length())
                return root->part.at(root_idx + idx);
        }
        else {
            command_node *n = S.top();
            if (n != NULL && idx < n->part.length())
                return n->part.at(idx);
        }
        return 0;
    }